

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

Page * page_merge_dirty(Page *pA,Page *pB)

{
  Page *pPVar1;
  Page *pPVar2;
  bool bVar3;
  bool bVar4;
  Page local_68;
  
  bVar3 = pA != (Page *)0x0;
  bVar4 = pB != (Page *)0x0;
  local_68.pDirtyPrev = (Page *)0x0;
  if (bVar3 && bVar4) {
    pPVar1 = &local_68;
    pPVar2 = pB;
    do {
      if (pA->pgno < pPVar2->pgno) {
        pPVar1->pDirtyPrev = pA;
        pA->pDirtyNext = pPVar1;
        pPVar1 = pA;
        pB = pPVar2;
        pA = pA->pDirtyPrev;
      }
      else {
        pPVar1->pDirtyPrev = pPVar2;
        pPVar2->pDirtyNext = pPVar1;
        pB = pPVar2->pDirtyPrev;
        pPVar1 = pPVar2;
      }
      bVar4 = pB != (Page *)0x0;
      bVar3 = pA != (Page *)0x0;
    } while ((bVar3) && (pPVar2 = pB, pB != (Page *)0x0));
  }
  else {
    pPVar1 = &local_68;
  }
  if (bVar3) {
    pPVar1->pDirtyPrev = pA;
    pA->pDirtyNext = pPVar1;
  }
  else if (bVar4) {
    pPVar1->pDirtyPrev = pB;
    pB->pDirtyNext = pPVar1;
  }
  else {
    pPVar1->pDirtyNext = (Page *)0x0;
    pPVar1->pDirtyPrev = (Page *)0x0;
  }
  return local_68.pDirtyPrev;
}

Assistant:

static Page * page_merge_dirty(Page *pA, Page *pB)
{
	Page result, *pTail;
    /* Prevent compiler warning */
	result.pDirtyNext = result.pDirtyPrev = 0;
	pTail = &result;
	while( pA && pB ){
		if( pA->pgno < pB->pgno ){
			pTail->pDirtyPrev = pA;
			pA->pDirtyNext = pTail;
			pTail = pA;
			pA = pA->pDirtyPrev;
		}else{
			pTail->pDirtyPrev = pB;
			pB->pDirtyNext = pTail;
			pTail = pB;
			pB = pB->pDirtyPrev;
		}
	}
	if( pA ){
		pTail->pDirtyPrev = pA;
		pA->pDirtyNext = pTail;
	}else if( pB ){
		pTail->pDirtyPrev = pB;
		pB->pDirtyNext = pTail;
	}else{
		pTail->pDirtyPrev = pTail->pDirtyNext = 0;
	}
	return result.pDirtyPrev;
}